

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

DiagnosticStream * __thiscall
spvtools::opt::GraphicsRobustAccessPass::Fail
          (DiagnosticStream *__return_storage_ptr__,GraphicsRobustAccessPass *this)

{
  spv_position_t position;
  int iVar1;
  MessageConsumer *consumer;
  undefined4 extraout_var;
  DiagnosticStream *pDVar2;
  char *local_238;
  allocator<char> local_229;
  string local_228;
  undefined8 local_208;
  undefined8 local_200;
  size_t local_1f8;
  DiagnosticStream local_1f0;
  GraphicsRobustAccessPass *local_18;
  GraphicsRobustAccessPass *this_local;
  
  (this->super_Pass).field_0x35 = 1;
  local_18 = this;
  this_local = (GraphicsRobustAccessPass *)__return_storage_ptr__;
  memset(&local_208,0,0x18);
  consumer = Pass::consumer(&this->super_Pass);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_229);
  position.column = local_200;
  position.line = local_208;
  position.index = local_1f8;
  DiagnosticStream::DiagnosticStream
            (&local_1f0,position,consumer,&local_228,SPV_ERROR_INVALID_BINARY);
  iVar1 = (*(this->super_Pass)._vptr_Pass[2])();
  local_238 = (char *)CONCAT44(extraout_var,iVar1);
  pDVar2 = DiagnosticStream::operator<<(&local_1f0,&local_238);
  pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [3])0x61bf26);
  DiagnosticStream::DiagnosticStream(__return_storage_ptr__,pDVar2);
  DiagnosticStream::~DiagnosticStream(&local_1f0);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  return __return_storage_ptr__;
}

Assistant:

spvtools::DiagnosticStream GraphicsRobustAccessPass::Fail() {
  module_status_.failed = true;
  // We don't really have a position, and we'll ignore the result.
  return std::move(
      spvtools::DiagnosticStream({}, consumer(), "", SPV_ERROR_INVALID_BINARY)
      << name() << ": ");
}